

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall kj::Maybe<kj::String>::Maybe(Maybe<kj::String> *this,Maybe<kj::String> *other)

{
  NullableValue<kj::String> *other_00;
  Maybe<kj::String> *other_local;
  Maybe<kj::String> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::String>>(&other->ptr);
  _::NullableValue<kj::String>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }